

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

atom_t attr_atom_from_string(char *str)

{
  atom_t aVar1;
  atom_t tmp;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  atl_lock();
  init_global_atom_server((atom_server *)0x1075fa);
  aVar1 = atom_from_string((atom_server)
                           CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                           in_stack_ffffffffffffffe8);
  atl_unlock();
  return aVar1;
}

Assistant:

extern
 atom_t
attr_atom_from_string(const char *str)
{
    atom_t tmp;
    atl_lock();
    init_global_atom_server(&global_as);
    tmp = atom_from_string(global_as, (char*)str);
    atl_unlock();
    return tmp;
}